

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O1

void __thiscall muduo::ThreadPool::runInThread(ThreadPool *this)

{
  Task task;
  _Any_data _Stack_38;
  code *local_28;
  code *local_20;
  
  if ((this->threadInitCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->threadInitCallback_)._M_invoker)((_Any_data *)&this->threadInitCallback_);
  }
  if (this->running_ == true) {
    do {
      take((Task *)&_Stack_38,this);
      if (local_28 != (code *)0x0) {
        (*local_20)(&_Stack_38);
      }
      if (local_28 != (code *)0x0) {
        (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
      }
    } while (this->running_ != false);
  }
  return;
}

Assistant:

void ThreadPool::runInThread()
{
  try
  {
    if (threadInitCallback_)
    {
      threadInitCallback_();
    }
    while (running_)
    {
      Task task(take());
      if (task)
      {
        task();
      }
    }
  }
  catch (const Exception& ex)
  {
    fprintf(stderr, "exception caught in ThreadPool %s\n", name_.c_str());
    fprintf(stderr, "reason: %s\n", ex.what());
    fprintf(stderr, "stack trace: %s\n", ex.stackTrace());
    abort();
  }
  catch (const std::exception& ex)
  {
    fprintf(stderr, "exception caught in ThreadPool %s\n", name_.c_str());
    fprintf(stderr, "reason: %s\n", ex.what());
    abort();
  }
  catch (...)
  {
    fprintf(stderr, "unknown exception caught in ThreadPool %s\n", name_.c_str());
    throw; // rethrow
  }
}